

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_next(HSQUIRRELVM v,SQInteger idx)

{
  bool bVar1;
  SQObjectPtr *pSVar2;
  int local_70 [2];
  int faketojump;
  SQObjectPtr val;
  SQObjectPtr realkey;
  SQObjectPtr *refpos;
  SQObjectPtr o;
  SQInteger idx_local;
  HSQUIRRELVM v_local;
  
  o.super_SQObject._unVal.nInteger = idx;
  pSVar2 = stack_get(v,idx);
  SQObjectPtr::SQObjectPtr((SQObjectPtr *)&refpos,pSVar2);
  pSVar2 = stack_get(v,-1);
  SQObjectPtr::SQObjectPtr((SQObjectPtr *)&val.super_SQObject._unVal);
  SQObjectPtr::SQObjectPtr((SQObjectPtr *)&faketojump);
  if ((int)refpos == 0x8000400) {
    v_local = (HSQUIRRELVM)sq_throwerror(v,"cannot iterate a generator");
  }
  else {
    bVar1 = SQVM::FOREACH_OP(v,(SQObjectPtr *)&refpos,(SQObjectPtr *)&val.super_SQObject._unVal,
                             (SQObjectPtr *)&faketojump,pSVar2,0,0x29a,local_70);
    if (bVar1) {
      if (local_70[0] == 0x29a) {
        v_local = (HSQUIRRELVM)0xffffffffffffffff;
      }
      else {
        SQVM::Push(v,(SQObjectPtr *)&val.super_SQObject._unVal);
        SQVM::Push(v,(SQObjectPtr *)&faketojump);
        v_local = (HSQUIRRELVM)0x0;
      }
    }
    else {
      v_local = (HSQUIRRELVM)0xffffffffffffffff;
    }
  }
  local_70[1] = 1;
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&faketojump);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&val.super_SQObject._unVal);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&refpos);
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sq_next(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr o=stack_get(v,idx),&refpos = stack_get(v,-1),realkey,val;
    if(type(o) == OT_GENERATOR) {
        return sq_throwerror(v,_SC("cannot iterate a generator"));
    }
    int faketojump;
    if(!v->FOREACH_OP(o,realkey,val,refpos,0,666,faketojump))
        return SQ_ERROR;
    if(faketojump != 666) {
        v->Push(realkey);
        v->Push(val);
        return SQ_OK;
    }
    return SQ_ERROR;
}